

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

void __thiscall
slang::ast::SampledValueExprVisitor::visit<slang::ast::SimpleAssignmentPatternExpression>
          (SampledValueExprVisitor *this,SimpleAssignmentPatternExpression *expr)

{
  ExpressionKind EVar1;
  size_type sVar2;
  pointer ppEVar3;
  Expression *this_00;
  Type *this_01;
  Symbol *pSVar4;
  iterator iVar5;
  Type *pTVar6;
  long lVar7;
  string_view sVar8;
  string_view local_30;
  
  EVar1 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  if (EVar1 == Call) {
    if (*(char *)&expr[1].super_AssignmentPatternExpressionBase.super_Expression.sourceRange.
                  startLoc == '\x01') {
      sVar8 = CallExpression::getSubroutineName((CallExpression *)expr);
      if (((sVar8._M_len == 7) &&
          (*(int *)((long)sVar8._M_str + 3) == 0x64656863 && *(int *)sVar8._M_str == 0x6374616d)) &&
         (expr[1].super_AssignmentPatternExpressionBase.elements_.size_ != 0)) {
        this_01 = ((*expr[1].super_AssignmentPatternExpressionBase.elements_.data_)->type).ptr;
        if (this_01 == (Type *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                    );
        }
        pTVar6 = this_01->canonical;
        if (pTVar6 == (Type *)0x0) {
          Type::resolveCanonical(this_01);
          pTVar6 = this_01->canonical;
        }
        if ((pTVar6->super_Symbol).kind == SequenceType) {
          ASTContext::addDiag(this->context,this->matchedCode,
                              (expr->super_AssignmentPatternExpressionBase).super_Expression.
                              sourceRange);
        }
      }
      if (this->isFutureGlobal == true) {
        local_30 = CallExpression::getSubroutineName((CallExpression *)expr);
        iVar5 = ska::detailv3::
                sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::find(&FutureGlobalNames.
                        super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       ,&local_30);
        if (iVar5.current !=
            FutureGlobalNames.
            super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .entries +
            FutureGlobalNames.
            super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .num_slots_minus_one +
            (long)FutureGlobalNames.
                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  .max_lookups) {
          ASTContext::addDiag(this->context,(DiagCode)0x180008,
                              (expr->super_AssignmentPatternExpressionBase).super_Expression.
                              sourceRange);
        }
      }
    }
  }
  else if (EVar1 == NamedValue) {
    pSVar4 = Expression::getSymbolReference((Expression *)expr,true);
    if ((pSVar4 != (Symbol *)0x0) &&
       ((pSVar4->kind == LocalAssertionVar ||
        ((pSVar4->kind == AssertionPort && (*(char *)((long)&pSVar4[2].name._M_len + 4) == '\x01')))
        ))) {
      ASTContext::addDiag(this->context,this->localVarCode,
                          (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange
                         );
      return;
    }
  }
  else {
    sVar2 = (expr->super_AssignmentPatternExpressionBase).elements_.size_;
    if (sVar2 != 0) {
      ppEVar3 = (expr->super_AssignmentPatternExpressionBase).elements_.data_;
      lVar7 = 0;
      do {
        this_00 = *(Expression **)((long)ppEVar3 + lVar7);
        Expression::
        visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
                  (this_00,this_00,this);
        lVar7 = lVar7 + 8;
      } while (sVar2 << 3 != lVar7);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::LocalAssertionVar ||
                            (sym->kind == SymbolKind::AssertionPort &&
                             sym->template as<AssertionPortSymbol>().isLocalVar())) {
                            context.addDiag(localVarCode, expr.sourceRange);
                        }
                    }
                    break;
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.isSystemCall()) {
                        if (call.getSubroutineName() == "matched"sv && !call.arguments().empty() &&
                            call.arguments()[0]->type->isSequenceType()) {
                            context.addDiag(matchedCode, expr.sourceRange);
                        }

                        if (isFutureGlobal && FutureGlobalNames.count(call.getSubroutineName())) {
                            context.addDiag(diag::GlobalSampledValueNested, expr.sourceRange);
                        }
                    }
                    break;
                }
                default:
                    if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T,
                                                SampledValueExprVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }